

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_min_limit.h
# Opt level: O0

double c74::min::scale<double>
                 (double value,double in_low,double in_high,double out_low,double out_high)

{
  undefined8 local_58;
  double normalized;
  double out_diff;
  double in_scale;
  number in_diff;
  double out_high_local;
  double out_low_local;
  double in_high_local;
  double in_low_local;
  double value_local;
  
  local_58 = in_high - in_low;
  if ((local_58 != 0.0) || (NAN(local_58))) {
    local_58 = 1.0 / local_58;
  }
  else {
    local_58 = 1.0;
  }
  return (value - in_low) * local_58 * (out_high - out_low) + out_low;
}

Assistant:

static T scale(const T value, const T in_low, const T in_high, const T out_low, const T out_high)
{
    const auto in_diff = static_cast<number>(in_high - in_low);
    const auto in_scale = (in_diff != 0.0) ? (1.0 / in_diff) : 1.0;
    const auto out_diff = out_high - out_low;
    const auto normalized = static_cast<T>((value - in_low) * in_scale);
    return static_cast<T>((normalized * out_diff) + out_low);
}